

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastInt32ToBuffer(int32 i,char *buffer)

{
  char *pcVar1;
  char *local_28;
  char *p;
  char *buffer_local;
  char *pcStack_10;
  int32 i_local;
  
  pcVar1 = buffer + 10;
  buffer[0xb] = '\0';
  buffer_local._4_4_ = i;
  if (i < 0) {
    if (i < -9) {
      *pcVar1 = (char)(-(i + 10) % 10) + '0';
      buffer_local._4_4_ = -(i + 10) / 10 + 1;
      local_28 = buffer + 9;
      do {
        pcStack_10 = local_28 + -1;
        *local_28 = (char)(buffer_local._4_4_ % 10) + '0';
        buffer_local._4_4_ = buffer_local._4_4_ / 10;
        local_28 = pcStack_10;
      } while (0 < buffer_local._4_4_);
      *pcStack_10 = '-';
    }
    else {
      pcStack_10 = buffer + 9;
      *pcVar1 = '0' - (char)i;
      *pcStack_10 = '-';
    }
  }
  else {
    do {
      local_28 = pcVar1;
      *local_28 = (char)(buffer_local._4_4_ % 10) + '0';
      buffer_local._4_4_ = buffer_local._4_4_ / 10;
      pcVar1 = local_28 + -1;
    } while (0 < buffer_local._4_4_);
    pcStack_10 = local_28;
  }
  return pcStack_10;
}

Assistant:

char *FastInt32ToBuffer(int32 i, char* buffer) {
  // We could collapse the positive and negative sections, but that
  // would be slightly slower for positive numbers...
  // 12 bytes is enough to store -2**32, -4294967296.
  char* p = buffer + kFastInt32ToBufferOffset;
  *p-- = '\0';
  if (i >= 0) {
    do {
      *p-- = '0' + i % 10;
      i /= 10;
    } while (i > 0);
    return p + 1;
  } else {
    // On different platforms, % and / have different behaviors for
    // negative numbers, so we need to jump through hoops to make sure
    // we don't divide negative numbers.
    if (i > -10) {
      i = -i;
      *p-- = '0' + i;
      *p = '-';
      return p;
    } else {
      // Make sure we aren't at MIN_INT, in which case we can't say i = -i
      i = i + 10;
      i = -i;
      *p-- = '0' + i % 10;
      // Undo what we did a moment ago
      i = i / 10 + 1;
      do {
        *p-- = '0' + i % 10;
        i /= 10;
      } while (i > 0);
      *p = '-';
      return p;
    }
  }
}